

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

int yaml_parser_update_buffer(yaml_parser_t *parser,size_t length)

{
  yaml_encoding_t yVar1;
  yaml_char_t *pyVar2;
  yaml_char_t *__src;
  yaml_char_t *pyVar3;
  short *psVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t __n;
  
  if (parser->read_handler == (yaml_read_handler_t *)0x0) {
    __assert_fail("parser->read_handler",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/reader.c"
                  ,0x92,"int yaml_parser_update_buffer(yaml_parser_t *, size_t)");
  }
  if ((parser->eof == 0) || ((parser->raw_buffer).pointer != (parser->raw_buffer).last)) {
    iVar16 = 1;
    if (parser->unread < length) {
      if (parser->encoding == YAML_ANY_ENCODING) {
        do {
          if ((parser->eof != 0) ||
             (2 < (long)(parser->raw_buffer).last - (long)(parser->raw_buffer).pointer)) {
            psVar4 = (short *)(parser->raw_buffer).pointer;
            lVar14 = (long)(parser->raw_buffer).last - (long)psVar4;
            if (lVar14 < 2) {
LAB_001107e2:
              if ((lVar14 < 3) || ((char)psVar4[1] != -0x41 || *psVar4 != -0x4411)) {
                parser->encoding = YAML_UTF8_ENCODING;
              }
              else {
                parser->encoding = YAML_UTF8_ENCODING;
                (parser->raw_buffer).pointer = (uchar *)((long)psVar4 + 3);
                parser->offset = parser->offset + 3;
              }
            }
            else {
              if (*psVar4 == -0x101) {
                parser->encoding = YAML_UTF16LE_ENCODING;
              }
              else {
                if (*psVar4 != -2) goto LAB_001107e2;
                parser->encoding = YAML_UTF16BE_ENCODING;
              }
              (parser->raw_buffer).pointer = (uchar *)(psVar4 + 1);
              parser->offset = parser->offset + 2;
            }
            goto LAB_00110739;
          }
          iVar8 = yaml_parser_update_raw_buffer(parser);
        } while (iVar8 != 0);
LAB_00110d96:
        iVar16 = 0;
      }
      else {
LAB_00110739:
        pyVar2 = (parser->buffer).start;
        __src = (parser->buffer).pointer;
        if ((pyVar2 < __src) && (pyVar3 = (parser->buffer).last, __src < pyVar3)) {
          __n = (long)pyVar3 - (long)__src;
          memmove(pyVar2,__src,__n);
          pyVar2 = (parser->buffer).start;
          (parser->buffer).pointer = pyVar2;
          (parser->buffer).last = pyVar2 + __n;
        }
        else if (__src == (parser->buffer).last) {
          (parser->buffer).pointer = pyVar2;
          (parser->buffer).last = pyVar2;
        }
        bVar7 = false;
        do {
          if (length <= parser->unread) {
            if (parser->offset < 0x7fffffffffffffff) {
              return 1;
            }
            parser->error = YAML_READER_ERROR;
            parser->problem = "input is too long";
            parser->problem_offset = parser->offset;
            parser->problem_value = -1;
            goto LAB_00110d96;
          }
          if (((bVar7) || ((parser->raw_buffer).pointer == (parser->raw_buffer).last)) &&
             (iVar8 = yaml_parser_update_raw_buffer(parser), iVar8 == 0)) goto LAB_00110d96;
          do {
            pbVar5 = (parser->raw_buffer).pointer;
            pbVar6 = (parser->raw_buffer).last;
            if (pbVar5 == pbVar6) goto LAB_00110d2d;
            uVar19 = (long)pbVar6 - (long)pbVar5;
            yVar1 = parser->encoding;
            bVar7 = true;
            if (yVar1 - YAML_UTF16LE_ENCODING < 2) {
              if (uVar19 < 2) {
                if (parser->eof == 0) {
                  bVar7 = false;
                  goto LAB_001109bf;
                }
                sVar11 = parser->offset;
                parser->error = YAML_READER_ERROR;
                parser->problem = "incomplete UTF-16 character";
LAB_00110a5d:
                parser->problem_offset = sVar11;
                parser->problem_value = -1;
                goto LAB_00110cdc;
              }
              uVar10 = (uint)CONCAT11(pbVar5[yVar1 == YAML_UTF16LE_ENCODING],
                                      pbVar5[yVar1 != YAML_UTF16LE_ENCODING]);
              uVar12 = (ulong)uVar10;
              bVar13 = pbVar5[yVar1 == YAML_UTF16LE_ENCODING] & 0xfc;
              if (bVar13 != 0xd8) {
                uVar17 = 2;
                if (bVar13 != 0xdc) goto LAB_001109c1;
                sVar11 = parser->offset;
                parser->error = YAML_READER_ERROR;
                pcVar15 = "unexpected low surrogate area";
LAB_00110cd0:
                parser->problem = pcVar15;
                goto LAB_00110cd4;
              }
              if (uVar19 < 4) {
                if (parser->eof != 0) {
                  sVar11 = parser->offset;
                  parser->error = YAML_READER_ERROR;
                  pcVar15 = "incomplete UTF-16 surrogate pair";
                  goto LAB_00110a59;
                }
                uVar17 = 4;
LAB_00110bff:
                bVar7 = false;
              }
              else {
                uVar18 = (uint)CONCAT11(pbVar5[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) ^ 3],
                                        pbVar5[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) + 2]);
                if ((pbVar5[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) ^ 3] & 0xfc) != 0xdc) {
                  parser->error = YAML_READER_ERROR;
                  parser->problem = "expected low surrogate area";
                  parser->problem_offset = parser->offset + 2;
                  parser->problem_value = uVar18;
                  goto LAB_00110cdc;
                }
                uVar12 = (ulong)((uVar10 & 0x3ff) * 0x400 + (uVar18 & 0x3ff) + 0x10000);
                uVar17 = 4;
              }
LAB_001109c1:
              uVar10 = (uint)uVar12;
              iVar8 = 5;
              if (bVar7) {
                if (((((0xd < uVar10) || ((0x2600U >> (uVar10 & 0x1f) & 1) == 0)) &&
                     (0xd75f < uVar10 - 0xa0)) && ((uVar10 != 0x85 && (0x5e < uVar10 - 0x20)))) &&
                   ((uVar10 < 0x10000 && (0x1ffd < uVar10 - 0xe000)))) {
                  sVar11 = parser->offset;
                  parser->error = YAML_READER_ERROR;
                  pcVar15 = "control characters are not allowed";
                  goto LAB_00110cd0;
                }
                (parser->raw_buffer).pointer = pbVar5 + uVar17;
                parser->offset = parser->offset + (ulong)uVar17;
                if (0x7f < uVar10) {
                  if (uVar10 < 0x800) {
                    bVar13 = (byte)(uVar12 >> 6) | 0xc0;
                  }
                  else {
                    if (uVar10 < 0x10000) {
                      bVar13 = (byte)(uVar10 >> 0xc) | 0xe0;
                    }
                    else {
                      pyVar2 = (parser->buffer).last;
                      (parser->buffer).last = pyVar2 + 1;
                      *pyVar2 = (char)(uVar10 >> 0x12) + 0xf0;
                      bVar13 = (byte)(uVar12 >> 0xc) & 0x3f | 0x80;
                    }
                    pbVar5 = (parser->buffer).last;
                    (parser->buffer).last = pbVar5 + 1;
                    *pbVar5 = bVar13;
                    bVar13 = (byte)(uVar12 >> 6) & 0x3f | 0x80;
                  }
                  pbVar5 = (parser->buffer).last;
                  (parser->buffer).last = pbVar5 + 1;
                  *pbVar5 = bVar13;
                  uVar12 = (ulong)((byte)uVar12 & 0x3f | 0x80);
                }
                pyVar2 = (parser->buffer).last;
                (parser->buffer).last = pyVar2 + 1;
                *pyVar2 = (yaml_char_t)uVar12;
                parser->unread = parser->unread + 1;
                iVar8 = 0;
              }
            }
            else {
              if (yVar1 != YAML_UTF8_ENCODING) {
LAB_001109bf:
                uVar12 = 0;
                uVar17 = 0;
                goto LAB_001109c1;
              }
              bVar13 = *pbVar5;
              uVar12 = (ulong)bVar13;
              uVar10 = (uint)bVar13;
              uVar17 = 1;
              uVar18 = (uint)bVar13;
              uVar9 = (uint)bVar13;
              if ((((char)bVar13 < '\0') && (uVar17 = 2, (uVar9 & 0xffffffe0) != 0xc0)) &&
                 (uVar17 = 3, (uVar9 & 0xfffffff0) != 0xe0)) {
                uVar17 = (uint)((uVar18 & 0xfffffff8) == 0xf0) << 2;
              }
              if (uVar17 != 0) {
                uVar20 = (ulong)uVar17;
                if (uVar19 < uVar20) {
                  if (parser->eof == 0) {
                    uVar12 = 0;
                    goto LAB_00110bff;
                  }
                  sVar11 = parser->offset;
                  parser->error = YAML_READER_ERROR;
                  pcVar15 = "incomplete UTF-8 octet sequence";
                }
                else {
                  if ((char)bVar13 < '\0') {
                    if ((uVar18 & 0xffffffe0) == 0xc0) {
                      uVar12 = (ulong)(uVar9 & 0x1f);
                    }
                    else if ((uVar9 & 0xfffffff0) == 0xe0) {
                      uVar12 = (ulong)(uVar18 & 0xf);
                    }
                    else {
                      uVar12 = (ulong)(uVar18 & 7);
                      if ((uVar9 & 0xfffffff8) != 0xf0) {
                        uVar12 = 0;
                      }
                    }
                  }
                  if (uVar17 != 1) {
                    if (uVar20 < 3) {
                      uVar20 = 2;
                    }
                    uVar19 = 1;
                    do {
                      bVar13 = pbVar5[uVar19];
                      if ((bVar13 & 0xffffffc0) != 0x80) {
                        parser->error = YAML_READER_ERROR;
                        parser->problem = "invalid trailing UTF-8 octet";
                        parser->problem_offset = uVar19 + parser->offset;
                        parser->problem_value = (uint)bVar13;
                        goto LAB_00110cdc;
                      }
                      uVar12 = (ulong)((int)uVar12 << 6 | bVar13 & 0x3f);
                      uVar19 = uVar19 + 1;
                    } while (uVar20 != uVar19);
                  }
                  uVar10 = (uint)uVar12;
                  if ((((uVar17 == 1) || ((uVar17 == 2 && (0x7f < uVar10)))) ||
                      ((uVar17 == 3 && (0x7ff < uVar10)))) || ((uVar17 == 4 && (0xffff < uVar10))))
                  {
                    if (uVar10 < 0x110000 && (uVar10 & 0xfffff800) != 0xd800) goto LAB_001109c1;
                    sVar11 = parser->offset;
                    parser->error = YAML_READER_ERROR;
                    pcVar15 = "invalid Unicode character";
                    goto LAB_00110cd0;
                  }
                  sVar11 = parser->offset;
                  parser->error = YAML_READER_ERROR;
                  pcVar15 = "invalid length of a UTF-8 sequence";
                }
LAB_00110a59:
                parser->problem = pcVar15;
                goto LAB_00110a5d;
              }
              sVar11 = parser->offset;
              parser->error = YAML_READER_ERROR;
              parser->problem = "invalid leading UTF-8 octet";
LAB_00110cd4:
              parser->problem_offset = sVar11;
              parser->problem_value = uVar10;
LAB_00110cdc:
              iVar8 = 1;
            }
          } while (iVar8 == 0);
          if (iVar8 != 5) goto LAB_00110d96;
LAB_00110d2d:
          bVar7 = true;
        } while (parser->eof == 0);
        pyVar2 = (parser->buffer).last;
        (parser->buffer).last = pyVar2 + 1;
        *pyVar2 = '\0';
        parser->unread = parser->unread + 1;
      }
    }
  }
  else {
    iVar16 = 1;
  }
  return iVar16;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_update_buffer(yaml_parser_t *parser, size_t length)
{
    int first = 1;

    assert(parser->read_handler);   /* Read handler must be set. */

    /* If the EOF flag is set and the raw buffer is empty, do nothing. */

    if (parser->eof && parser->raw_buffer.pointer == parser->raw_buffer.last)
        return 1;

    /* Return if the buffer contains enough characters. */

    if (parser->unread >= length)
        return 1;

    /* Determine the input encoding if it is not known yet. */

    if (!parser->encoding) {
        if (!yaml_parser_determine_encoding(parser))
            return 0;
    }

    /* Move the unread characters to the beginning of the buffer. */

    if (parser->buffer.start < parser->buffer.pointer
            && parser->buffer.pointer < parser->buffer.last) {
        size_t size = parser->buffer.last - parser->buffer.pointer;
        memmove(parser->buffer.start, parser->buffer.pointer, size);
        parser->buffer.pointer = parser->buffer.start;
        parser->buffer.last = parser->buffer.start + size;
    }
    else if (parser->buffer.pointer == parser->buffer.last) {
        parser->buffer.pointer = parser->buffer.start;
        parser->buffer.last = parser->buffer.start;
    }

    /* Fill the buffer until it has enough characters. */

    while (parser->unread < length)
    {
        /* Fill the raw buffer if necessary. */

        if (!first || parser->raw_buffer.pointer == parser->raw_buffer.last) {
            if (!yaml_parser_update_raw_buffer(parser)) return 0;
        }
        first = 0;

        /* Decode the raw buffer. */

        while (parser->raw_buffer.pointer != parser->raw_buffer.last)
        {
            unsigned int value = 0, value2 = 0;
            int incomplete = 0;
            unsigned char octet;
            unsigned int width = 0;
            int low, high;
            size_t k;
            size_t raw_unread = parser->raw_buffer.last - parser->raw_buffer.pointer;

            /* Decode the next character. */

            switch (parser->encoding)
            {
                case YAML_UTF8_ENCODING:

                    /*
                     * Decode a UTF-8 character.  Check RFC 3629
                     * (http://www.ietf.org/rfc/rfc3629.txt) for more details.
                     *
                     * The following table (taken from the RFC) is used for
                     * decoding.
                     *
                     *    Char. number range |        UTF-8 octet sequence
                     *      (hexadecimal)    |              (binary)
                     *   --------------------+------------------------------------
                     *   0000 0000-0000 007F | 0xxxxxxx
                     *   0000 0080-0000 07FF | 110xxxxx 10xxxxxx
                     *   0000 0800-0000 FFFF | 1110xxxx 10xxxxxx 10xxxxxx
                     *   0001 0000-0010 FFFF | 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
                     *
                     * Additionally, the characters in the range 0xD800-0xDFFF
                     * are prohibited as they are reserved for use with UTF-16
                     * surrogate pairs.
                     */

                    /* Determine the length of the UTF-8 sequence. */

                    octet = parser->raw_buffer.pointer[0];
                    width = (octet & 0x80) == 0x00 ? 1 :
                            (octet & 0xE0) == 0xC0 ? 2 :
                            (octet & 0xF0) == 0xE0 ? 3 :
                            (octet & 0xF8) == 0xF0 ? 4 : 0;

                    /* Check if the leading octet is valid. */

                    if (!width)
                        return yaml_parser_set_reader_error(parser,
                                "invalid leading UTF-8 octet",
                                parser->offset, octet);

                    /* Check if the raw buffer contains an incomplete character. */

                    if (width > raw_unread) {
                        if (parser->eof) {
                            return yaml_parser_set_reader_error(parser,
                                    "incomplete UTF-8 octet sequence",
                                    parser->offset, -1);
                        }
                        incomplete = 1;
                        break;
                    }

                    /* Decode the leading octet. */

                    value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                            (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                            (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                            (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;

                    /* Check and decode the trailing octets. */

                    for (k = 1; k < width; k ++)
                    {
                        octet = parser->raw_buffer.pointer[k];

                        /* Check if the octet is valid. */

                        if ((octet & 0xC0) != 0x80)
                            return yaml_parser_set_reader_error(parser,
                                    "invalid trailing UTF-8 octet",
                                    parser->offset+k, octet);

                        /* Decode the octet. */

                        value = (value << 6) + (octet & 0x3F);
                    }

                    /* Check the length of the sequence against the value. */

                    if (!((width == 1) ||
                            (width == 2 && value >= 0x80) ||
                            (width == 3 && value >= 0x800) ||
                            (width == 4 && value >= 0x10000)))
                        return yaml_parser_set_reader_error(parser,
                                "invalid length of a UTF-8 sequence",
                                parser->offset, -1);

                    /* Check the range of the value. */

                    if ((value >= 0xD800 && value <= 0xDFFF) || value > 0x10FFFF)
                        return yaml_parser_set_reader_error(parser,
                                "invalid Unicode character",
                                parser->offset, value);

                    break;

                case YAML_UTF16LE_ENCODING:
                case YAML_UTF16BE_ENCODING:

                    low = (parser->encoding == YAML_UTF16LE_ENCODING ? 0 : 1);
                    high = (parser->encoding == YAML_UTF16LE_ENCODING ? 1 : 0);

                    /*
                     * The UTF-16 encoding is not as simple as one might
                     * naively think.  Check RFC 2781
                     * (http://www.ietf.org/rfc/rfc2781.txt).
                     *
                     * Normally, two subsequent bytes describe a Unicode
                     * character.  However a special technique (called a
                     * surrogate pair) is used for specifying character
                     * values larger than 0xFFFF.
                     *
                     * A surrogate pair consists of two pseudo-characters:
                     *      high surrogate area (0xD800-0xDBFF)
                     *      low surrogate area (0xDC00-0xDFFF)
                     *
                     * The following formulas are used for decoding
                     * and encoding characters using surrogate pairs:
                     *
                     *  U  = U' + 0x10000   (0x01 00 00 <= U <= 0x10 FF FF)
                     *  U' = yyyyyyyyyyxxxxxxxxxx   (0 <= U' <= 0x0F FF FF)
                     *  W1 = 110110yyyyyyyyyy
                     *  W2 = 110111xxxxxxxxxx
                     *
                     * where U is the character value, W1 is the high surrogate
                     * area, W2 is the low surrogate area.
                     */

                    /* Check for incomplete UTF-16 character. */

                    if (raw_unread < 2) {
                        if (parser->eof) {
                            return yaml_parser_set_reader_error(parser,
                                    "incomplete UTF-16 character",
                                    parser->offset, -1);
                        }
                        incomplete = 1;
                        break;
                    }

                    /* Get the character. */

                    value = parser->raw_buffer.pointer[low]
                        + (parser->raw_buffer.pointer[high] << 8);

                    /* Check for unexpected low surrogate area. */

                    if ((value & 0xFC00) == 0xDC00)
                        return yaml_parser_set_reader_error(parser,
                                "unexpected low surrogate area",
                                parser->offset, value);

                    /* Check for a high surrogate area. */

                    if ((value & 0xFC00) == 0xD800) {

                        width = 4;

                        /* Check for incomplete surrogate pair. */

                        if (raw_unread < 4) {
                            if (parser->eof) {
                                return yaml_parser_set_reader_error(parser,
                                        "incomplete UTF-16 surrogate pair",
                                        parser->offset, -1);
                            }
                            incomplete = 1;
                            break;
                        }

                        /* Get the next character. */

                        value2 = parser->raw_buffer.pointer[low+2]
                            + (parser->raw_buffer.pointer[high+2] << 8);

                        /* Check for a low surrogate area. */

                        if ((value2 & 0xFC00) != 0xDC00)
                            return yaml_parser_set_reader_error(parser,
                                    "expected low surrogate area",
                                    parser->offset+2, value2);

                        /* Generate the value of the surrogate pair. */

                        value = 0x10000 + ((value & 0x3FF) << 10) + (value2 & 0x3FF);
                    }

                    else {
                        width = 2;
                    }

                    break;

                default:
                    assert(1);      /* Impossible. */
            }

            /* Check if the raw buffer contains enough bytes to form a character. */

            if (incomplete) break;

            /*
             * Check if the character is in the allowed range:
             *      #x9 | #xA | #xD | [#x20-#x7E]               (8 bit)
             *      | #x85 | [#xA0-#xD7FF] | [#xE000-#xFFFD]    (16 bit)
             *      | [#x10000-#x10FFFF]                        (32 bit)
             */

            if (! (value == 0x09 || value == 0x0A || value == 0x0D
                        || (value >= 0x20 && value <= 0x7E)
                        || (value == 0x85) || (value >= 0xA0 && value <= 0xD7FF)
                        || (value >= 0xE000 && value <= 0xFFFD)
                        || (value >= 0x10000 && value <= 0x10FFFF)))
                return yaml_parser_set_reader_error(parser,
                        "control characters are not allowed",
                        parser->offset, value);

            /* Move the raw pointers. */

            parser->raw_buffer.pointer += width;
            parser->offset += width;

            /* Finally put the character into the buffer. */

            /* 0000 0000-0000 007F -> 0xxxxxxx */
            if (value <= 0x7F) {
                *(parser->buffer.last++) = value;
            }
            /* 0000 0080-0000 07FF -> 110xxxxx 10xxxxxx */
            else if (value <= 0x7FF) {
                *(parser->buffer.last++) = 0xC0 + (value >> 6);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }
            /* 0000 0800-0000 FFFF -> 1110xxxx 10xxxxxx 10xxxxxx */
            else if (value <= 0xFFFF) {
                *(parser->buffer.last++) = 0xE0 + (value >> 12);
                *(parser->buffer.last++) = 0x80 + ((value >> 6) & 0x3F);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }
            /* 0001 0000-0010 FFFF -> 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
            else {
                *(parser->buffer.last++) = 0xF0 + (value >> 18);
                *(parser->buffer.last++) = 0x80 + ((value >> 12) & 0x3F);
                *(parser->buffer.last++) = 0x80 + ((value >> 6) & 0x3F);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }

            parser->unread ++;
        }

        /* On EOF, put NUL into the buffer and return. */

        if (parser->eof) {
            *(parser->buffer.last++) = '\0';
            parser->unread ++;
            return 1;
        }

    }

    if (parser->offset >= MAX_FILE_SIZE) {
        return yaml_parser_set_reader_error(parser, "input is too long",
            parser->offset, -1);
    }

    return 1;
}